

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

void cvProcessError(CVodeMem cv_mem,int error_code,char *module,char *fname,char *msgfmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  char *in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char msg [256];
  va_list ap;
  undefined1 auStack_1f8 [40];
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  char local_148 [256];
  undefined4 local_48;
  undefined4 local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_c;
  long local_8;
  
  local_38 = auStack_1f8;
  if (in_AL != '\0') {
    local_1c8 = in_XMM0_Qa;
    local_1b8 = in_XMM1_Qa;
    local_1a8 = in_XMM2_Qa;
    local_198 = in_XMM3_Qa;
    local_188 = in_XMM4_Qa;
    local_178 = in_XMM5_Qa;
    local_168 = in_XMM6_Qa;
    local_158 = in_XMM7_Qa;
  }
  local_40 = &stack0x00000008;
  local_44 = 0x30;
  local_48 = 0x28;
  local_1d0 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  vsprintf(local_148,in_R8,&local_48);
  if (local_8 == 0) {
    fprintf(_stderr,"\n[%s ERROR]  %s\n  ",local_18,local_20);
    fprintf(_stderr,"%s\n\n",local_148);
  }
  else {
    (**(code **)(local_8 + 0x470))
              (local_c,local_18,local_20,local_148,*(undefined8 *)(local_8 + 0x478));
  }
  return;
}

Assistant:

void cvProcessError(CVodeMem cv_mem,
                    int error_code, const char *module, const char *fname,
                    const char *msgfmt, ...)
{
  va_list ap;
  char msg[256];

  /* Initialize the argument pointer variable
     (msgfmt is the last required argument to cvProcessError) */

  va_start(ap, msgfmt);

  /* Compose the message */

  vsprintf(msg, msgfmt, ap);

  if (cv_mem == NULL) {    /* We write to stderr */
#ifndef NO_FPRINTF_OUTPUT
    fprintf(stderr, "\n[%s ERROR]  %s\n  ", module, fname);
    fprintf(stderr, "%s\n\n", msg);
#endif

  } else {                 /* We can call ehfun */
    cv_mem->cv_ehfun(error_code, module, fname, msg, cv_mem->cv_eh_data);
  }

  /* Finalize argument processing */
  va_end(ap);

  return;
}